

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::GoniometricLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,GoniometricLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  anon_struct_8_0_00000001_for___align aVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  Point2f p;
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  Vector3f VVar10;
  SampledSpectrum SVar11;
  Float pdf;
  Ray ray;
  float local_8c;
  undefined1 local_88 [16];
  Tuple2<pbrt::Point2,_float> local_78;
  Ray local_70;
  Ray local_48;
  undefined1 auVar5 [64];
  undefined1 auVar9 [56];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_78 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4._0_16_);
  p = PiecewiseConstant2D::Sample(&this->distrib,(Point2f *)&local_78,&local_8c);
  auVar7 = extraout_var;
  VVar10 = EqualAreaSquareToSphere(p);
  auVar5._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar7;
  local_88 = auVar5._0_16_;
  local_70.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_LightBase).mediumInterface.outside.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(local_88);
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  local_70.time = time;
  Transform::operator()(&local_48,&(this->super_LightBase).renderFromLight,&local_70,(Float *)0x0);
  auVar3 = local_88;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_88._0_4_;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_88._4_4_;
  auVar9 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
  auVar7 = ZEXT856((ulong)local_88._8_8_);
  local_88 = auVar3;
  SVar11 = I(this,VVar10,lambda);
  auVar8._0_8_ = SVar11.values.values._8_8_;
  auVar8._8_56_ = auVar9;
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_48.o.super_Tuple3<pbrt::Point3,_float>._0_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       CONCAT44(local_48.d.super_Tuple3<pbrt::Vector3,_float>.x,
                local_48.o.super_Tuple3<pbrt::Point3,_float>.z);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
       CONCAT44(local_48.d.super_Tuple3<pbrt::Vector3,_float>.y,
                local_48.d.super_Tuple3<pbrt::Vector3,_float>.x);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_48._20_8_;
  __return_storage_ptr__->set = true;
  aVar1 = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar6._0_16_);
  (__return_storage_ptr__->optionalValue).__align = aVar1;
  uVar2 = vmovlps_avx(auVar8._0_16_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uVar2;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x30))->bits =
       (uintptr_t)
       local_48.medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0x3f800000;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x94) = local_8c / 12.566371;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> GoniometricLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample direction and PDF for ray leaving goniometric light
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Vector3f wl = EqualAreaSquareToSphere(uv);
    Float pdfDir = pdf / (4 * Pi);

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(I(wl, lambda), ray, 1, pdfDir);
}